

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KCPServer.cpp
# Opt level: O3

void __thiscall net_uv::KCPServer::onNewConnect(KCPServer *this,Socket *socket)

{
  KCPSession *pKVar1;
  char *format;
  _Any_data local_48;
  code *local_38;
  code *local_30;
  
  if (socket == (Socket *)0x0) {
    format = "Failed to accept new connection";
  }
  else {
    pKVar1 = KCPSession::createSession
                       (&(this->super_Server).super_SessionManager,(KCPSocket *)socket);
    if (pKVar1 != (KCPSession *)0x0) {
      local_48._8_8_ = 0;
      local_48._M_unused._M_object = operator_new(0x18);
      *(code **)local_48._M_unused._0_8_ = onSessionRecvData;
      *(undefined8 *)((long)local_48._M_unused._0_8_ + 8) = 0;
      *(KCPServer **)((long)local_48._M_unused._0_8_ + 0x10) = this;
      local_30 = std::
                 _Function_handler<void_(net_uv::Session_*,_char_*,_unsigned_int),_std::_Bind<void_(net_uv::KCPServer::*(net_uv::KCPServer_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>))(net_uv::Session_*,_char_*,_unsigned_int)>_>
                 ::_M_invoke;
      local_38 = std::
                 _Function_handler<void_(net_uv::Session_*,_char_*,_unsigned_int),_std::_Bind<void_(net_uv::KCPServer::*(net_uv::KCPServer_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>))(net_uv::Session_*,_char_*,_unsigned_int)>_>
                 ::_M_manager;
      std::function<void_(net_uv::Session_*,_char_*,_unsigned_int)>::operator=
                (&(pKVar1->super_Session).m_sessionRecvCallback,
                 (function<void_(net_uv::Session_*,_char_*,_unsigned_int)> *)&local_48);
      if (local_38 != (code *)0x0) {
        (*local_38)(&local_48,&local_48,__destroy_functor);
      }
      local_48._8_8_ = 0;
      local_48._M_unused._M_object = operator_new(0x18);
      *(code **)local_48._M_unused._0_8_ = onSessionClose;
      *(undefined8 *)((long)local_48._M_unused._0_8_ + 8) = 0;
      *(KCPServer **)((long)local_48._M_unused._0_8_ + 0x10) = this;
      local_30 = std::
                 _Function_handler<void_(net_uv::Session_*),_std::_Bind<void_(net_uv::KCPServer::*(net_uv::KCPServer_*,_std::_Placeholder<1>))(net_uv::Session_*)>_>
                 ::_M_invoke;
      local_38 = std::
                 _Function_handler<void_(net_uv::Session_*),_std::_Bind<void_(net_uv::KCPServer::*(net_uv::KCPServer_*,_std::_Placeholder<1>))(net_uv::Session_*)>_>
                 ::_M_manager;
      std::function<void_(net_uv::Session_*)>::operator=
                (&(pKVar1->super_Session).m_sessionCloseCallback,
                 (function<void_(net_uv::Session_*)> *)&local_48);
      if (local_38 != (code *)0x0) {
        (*local_38)(&local_48,&local_48,__destroy_functor);
      }
      (pKVar1->super_Session).m_sessionID =
           *(uint32_t *)((long)&socket[1].m_connectCall.super__Function_base._M_functor + 8);
      (*(pKVar1->super_Session)._vptr_Session[0xb])(pKVar1,1);
      local_48._0_4_ = (pKVar1->super_Session).m_sessionID;
      local_38 = (code *)((ulong)local_38 & 0xffffffffffffff00);
      local_48._8_8_ = pKVar1;
      std::
      _Rb_tree<unsigned_int,std::pair<unsigned_int_const,net_uv::KCPServer::serverSessionData>,std::_Select1st<std::pair<unsigned_int_const,net_uv::KCPServer::serverSessionData>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,net_uv::KCPServer::serverSessionData>>>
      ::_M_emplace_unique<std::pair<unsigned_int,net_uv::KCPServer::serverSessionData>>
                ((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,net_uv::KCPServer::serverSessionData>,std::_Select1st<std::pair<unsigned_int_const,net_uv::KCPServer::serverSessionData>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,net_uv::KCPServer::serverSessionData>>>
                  *)&this->m_allSession,
                 (pair<unsigned_int,_net_uv::KCPServer::serverSessionData> *)&local_48);
      (*(this->super_Server).super_Runnable._vptr_Runnable[5])(this,5,pKVar1,0,0);
      return;
    }
    format = "The server failed to create a new session.";
  }
  net_uvLog(3,format);
  return;
}

Assistant:

void KCPServer::onNewConnect(Socket* socket)
{
	if (socket != NULL)
	{
		KCPSession* session = KCPSession::createSession(this, (KCPSocket*)socket);
		if (session == NULL)
		{
			NET_UV_LOG(NET_UV_L_ERROR, "The server failed to create a new session.");
		}
		else
		{
			session->setSessionRecvCallback(std::bind(&KCPServer::onSessionRecvData, this, std::placeholders::_1, std::placeholders::_2, std::placeholders::_3));
			session->setSessionClose(std::bind(&KCPServer::onSessionClose, this, std::placeholders::_1));
			session->setSessionID(((KCPSocket*)socket)->getConv());
			session->setIsOnline(true);
			addNewSession(session);
		}
	}
	else
	{
		NET_UV_LOG(NET_UV_L_ERROR, "Failed to accept new connection");
	}
}